

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

void cleanup_pits(void)

{
  pit_color_profile *ppVar1;
  pit_forbidden_monster *ppVar2;
  pit_monster_profile *ppVar3;
  pit_profile *ppVar4;
  pit_color_profile *p;
  pit_forbidden_monster *p_00;
  pit_monster_profile *p_01;
  ulong uVar5;
  
  for (uVar5 = 0; ppVar4 = pit_info, uVar5 < z_info->pit_max; uVar5 = uVar5 + 1) {
    p = pit_info[uVar5].colors;
    while (p != (pit_color_profile *)0x0) {
      ppVar1 = p->next;
      mem_free(p);
      p = ppVar1;
    }
    p_00 = ppVar4[uVar5].forbidden_monsters;
    while (p_00 != (pit_forbidden_monster *)0x0) {
      ppVar2 = p_00->next;
      mem_free(p_00);
      p_00 = ppVar2;
    }
    p_01 = ppVar4[uVar5].bases;
    while (p_01 != (pit_monster_profile *)0x0) {
      ppVar3 = p_01->next;
      mem_free(p_01);
      p_01 = ppVar3;
    }
    string_free(pit_info[uVar5].name);
  }
  mem_free(pit_info);
  return;
}

Assistant:

static void cleanup_pits(void)
{
	int idx;
	
	for (idx = 0; idx < z_info->pit_max; idx++) {
		struct pit_profile *pit = &pit_info[idx];
		struct pit_color_profile *c, *cn;
		struct pit_forbidden_monster *m, *mn;
		struct pit_monster_profile *b, *bn;
		
		c = pit->colors;
		while (c) {
			cn = c->next;
			mem_free(c);
			c = cn;
		}
		m = pit->forbidden_monsters;
		while (m) {
			mn = m->next;
			mem_free(m);
			m = mn;
		}
		b = pit->bases;
		while (b) {
			bn = b->next;
			mem_free(b);
			b = bn;
		}
		string_free((char *)pit_info[idx].name);
		
	}
	mem_free(pit_info);
}